

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetCommandQueueTypeString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,COMMAND_QUEUE_TYPE Type)

{
  COMMAND_QUEUE_TYPE CVar1;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  allocator local_12;
  COMMAND_QUEUE_TYPE local_11;
  String *pSStack_10;
  COMMAND_QUEUE_TYPE Type_local;
  String *Result;
  
  local_11 = (COMMAND_QUEUE_TYPE)this;
  pSStack_10 = __return_storage_ptr__;
  if (local_11 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
  }
  else {
    msg.field_2._M_local_buf[0xb] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    CVar1 = operator&(local_11,COMMAND_QUEUE_TYPE_GRAPHICS);
    if (CVar1 == COMMAND_QUEUE_TYPE_GRAPHICS) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"GRAPHICS");
    }
    else {
      CVar1 = operator&(local_11,COMMAND_QUEUE_TYPE_COMPUTE);
      if (CVar1 == COMMAND_QUEUE_TYPE_COMPUTE) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"COMPUTE");
      }
      else {
        CVar1 = operator&(local_11,COMMAND_QUEUE_TYPE_TRANSFER);
        if (CVar1 == COMMAND_QUEUE_TYPE_TRANSFER) {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,"TRANSFER");
        }
        else {
          FormatString<char[24]>((string *)local_48,(char (*) [24])"Unexpected context type");
          Message = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (Message,"GetCommandQueueTypeString",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                     ,0x9ca);
          std::__cxx11::string::~string((string *)local_48);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,"UNKNOWN");
        }
      }
    }
    CVar1 = operator&(local_11,COMMAND_QUEUE_TYPE_SPARSE_BINDING);
    if (CVar1 != COMMAND_QUEUE_TYPE_UNKNOWN) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," | SPARSE_BINDING");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetCommandQueueTypeString(COMMAND_QUEUE_TYPE Type)
{
    static_assert(COMMAND_QUEUE_TYPE_MAX_BIT == 0x7, "Please update the code below to handle the new command queue type");

    if (Type == COMMAND_QUEUE_TYPE_UNKNOWN)
        return "UNKNOWN";

    String Result;
    if ((Type & COMMAND_QUEUE_TYPE_GRAPHICS) == COMMAND_QUEUE_TYPE_GRAPHICS)
        Result = "GRAPHICS";
    else if ((Type & COMMAND_QUEUE_TYPE_COMPUTE) == COMMAND_QUEUE_TYPE_COMPUTE)
        Result = "COMPUTE";
    else if ((Type & COMMAND_QUEUE_TYPE_TRANSFER) == COMMAND_QUEUE_TYPE_TRANSFER)
        Result = "TRANSFER";
    else
    {
        UNEXPECTED("Unexpected context type");
        Result = "UNKNOWN";
    }

    if ((Type & COMMAND_QUEUE_TYPE_SPARSE_BINDING) != 0)
        Result += " | SPARSE_BINDING";

    return Result;
}